

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

ArgIface * __thiscall Args::GroupIface::findArgument(GroupIface *this,String *name)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  long in_RDI;
  ArgIface *tmp;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffffb8;
  ArgIface *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  local_28;
  type *local_20;
  undefined8 local_18;
  
  local_18 = in_RSI;
  local_20 = details::
             asConst<std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>
                       ((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                         *)(in_RDI + 0x10));
  local_28._M_current =
       (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
       std::
       vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return (ArgIface *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
    ::operator*(&local_28);
    pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x1407ed);
    iVar2 = (*pAVar3->_vptr_ArgIface[0xe])(pAVar3,local_18);
    in_stack_ffffffffffffffc0 = (ArgIface *)CONCAT44(extraout_var,iVar2);
    if (in_stack_ffffffffffffffc0 != (ArgIface *)0x0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
    ::operator++(&local_28);
  }
  return in_stack_ffffffffffffffc0;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		for( const auto & arg : details::asConst( m_children ) )
		{
			ArgIface * tmp = arg->findArgument( name );

			if( tmp != nullptr )
				return tmp;
		}

		return nullptr;
	}